

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommMPI.cpp
# Opt level: O0

void __thiscall
adios2::helper::CommImplMPI::Gatherv
          (CommImplMPI *this,void *sendbuf,size_t sendcount,Datatype sendtype,void *recvbuf,
          size_t *recvcounts,size_t *displs,Datatype recvtype,int root,string *hint)

{
  int iVar1;
  int iVar2;
  back_insert_iterator<std::vector<int,_std::allocator<int>_>_> bVar3;
  MPI_Datatype poVar4;
  int *piVar5;
  int *piVar6;
  MPI_Datatype poVar7;
  Datatype in_ECX;
  undefined4 in_EDX;
  string *unaff_RBX;
  undefined8 in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  long in_R9;
  int unaff_retaddr;
  long in_stack_00000008;
  Datatype in_stack_00000010;
  int in_stack_00000018;
  int size;
  anon_class_1_0_00000001 cast;
  vector<int,_std::allocator<int>_> displsInt;
  vector<int,_std::allocator<int>_> countsInt;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe98;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffeb0;
  size_type in_stack_fffffffffffffec8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffed0;
  
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1a0fd2);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1a0fdf);
  iVar2 = in_stack_00000018;
  iVar1 = (**(code **)(*in_RDI + 0x38))();
  if (iVar2 == iVar1) {
    iVar2 = (**(code **)(*in_RDI + 0x40))();
    std::vector<int,_std::allocator<int>_>::reserve
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    bVar3 = std::back_inserter<std::vector<int,std::allocator<int>>>(in_stack_fffffffffffffe98);
    std::
    transform<unsigned_long_const*,std::back_insert_iterator<std::vector<int,std::allocator<int>>>,adios2::helper::CommImplMPI::Gatherv(void_const*,unsigned_long,adios2::helper::CommImpl::Datatype,void*,unsigned_long_const*,unsigned_long_const*,adios2::helper::CommImpl::Datatype,int,std::__cxx11::string_const&)const::__0>
              (in_R9,in_R9 + (long)iVar2 * 8,bVar3.container);
    std::vector<int,_std::allocator<int>_>::reserve
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    bVar3 = std::back_inserter<std::vector<int,std::allocator<int>>>(in_stack_fffffffffffffe98);
    std::
    transform<unsigned_long_const*,std::back_insert_iterator<std::vector<int,std::allocator<int>>>,adios2::helper::CommImplMPI::Gatherv(void_const*,unsigned_long,adios2::helper::CommImpl::Datatype,void*,unsigned_long_const*,unsigned_long_const*,adios2::helper::CommImpl::Datatype,int,std::__cxx11::string_const&)const::__0>
              (in_stack_00000008,in_stack_00000008 + (long)iVar2 * 8,bVar3.container);
  }
  poVar4 = anon_unknown_1::ToMPI(in_ECX);
  piVar5 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x1a11d9);
  piVar6 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x1a11eb);
  poVar7 = anon_unknown_1::ToMPI(in_stack_00000010);
  MPI_Gatherv(in_RSI,in_EDX,poVar4,in_R8,piVar5,piVar6,poVar7,in_stack_00000018,in_RDI[1]);
  anon_unknown_1::CheckMPIReturn(unaff_retaddr,unaff_RBX);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffeb0);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffeb0);
  return;
}

Assistant:

void CommImplMPI::Gatherv(const void *sendbuf, size_t sendcount, Datatype sendtype, void *recvbuf,
                          const size_t *recvcounts, const size_t *displs, Datatype recvtype,
                          int root, const std::string &hint) const
{
    std::vector<int> countsInt;
    std::vector<int> displsInt;
    if (root == this->Rank())
    {
        auto cast = [](size_t sz) -> int { return int(sz); };
        const int size = this->Size();
        countsInt.reserve(size);
        std::transform(recvcounts, recvcounts + size, std::back_inserter(countsInt), cast);
        displsInt.reserve(size);
        std::transform(displs, displs + size, std::back_inserter(displsInt), cast);
    }
    CheckMPIReturn(MPI_Gatherv(sendbuf, static_cast<int>(sendcount), ToMPI(sendtype), recvbuf,
                               countsInt.data(), displsInt.data(), ToMPI(recvtype), root,
                               m_MPIComm),
                   hint);
}